

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

char * String::findLast(char *in,char *str)

{
  char *result;
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  do {
    pcVar1 = pcVar2;
    pcVar2 = strstr(in,str);
    in = pcVar2 + 1;
  } while (pcVar2 != (char *)0x0);
  return pcVar1;
}

Assistant:

const char* String::findLast(const char* in, const char* str)
{
  const char* result = 0;
  const char* match = strstr(in, str);
  for(;;)
  {
    if(!match)
      return result;
    result = match;
    match = strstr(match + 1, str);
  }
}